

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_float32_primitive_asUInt16
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  float fVar2;
  sysbvm_object_tuple_t *floatObject;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar1 = *arguments;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    fVar2 = *(float *)(uVar1 + 0x10);
  }
  else {
    fVar2 = (float)(uVar1 >> 4);
  }
  return (ulong)(((int)fVar2 & 0xffffU) << 4) | 6;
}

Assistant:

static sysbvm_tuple_t sysbvm_float32_primitive_asUInt16(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    return sysbvm_tuple_uint16_encode((uint16_t)sysbvm_tuple_float32_decode(arguments[0]));
}